

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

bool CoreML::hasCategoricalSequences(Model *model)

{
  int iVar1;
  TypeCase TVar2;
  TypeCase TVar3;
  ModelDescription *pMVar4;
  FeatureDescription *pFVar5;
  FeatureType *pFVar6;
  SequenceFeatureType *pSVar7;
  FeatureDescription *feature_1;
  int i_1;
  FeatureDescription *feature;
  int i;
  Model *model_local;
  
  feature._4_4_ = 0;
  do {
    pMVar4 = Specification::Model::description(model);
    iVar1 = Specification::ModelDescription::input_size(pMVar4);
    if (iVar1 <= feature._4_4_) {
      feature_1._4_4_ = 0;
      do {
        pMVar4 = Specification::Model::description(model);
        iVar1 = Specification::ModelDescription::output_size(pMVar4);
        if (iVar1 <= feature_1._4_4_) {
          return false;
        }
        pMVar4 = Specification::Model::description(model);
        pFVar5 = Specification::ModelDescription::output(pMVar4,feature_1._4_4_);
        pFVar6 = Specification::FeatureDescription::type(pFVar5);
        TVar2 = Specification::FeatureType::Type_case(pFVar6);
        if (TVar2 == kSequenceType) {
          pFVar6 = Specification::FeatureDescription::type(pFVar5);
          pSVar7 = Specification::FeatureType::sequencetype(pFVar6);
          TVar3 = Specification::SequenceFeatureType::Type_case(pSVar7);
          if ((TVar3 | 2) == kStringType) {
            return true;
          }
        }
        feature_1._4_4_ = feature_1._4_4_ + 1;
      } while( true );
    }
    pMVar4 = Specification::Model::description(model);
    pFVar5 = Specification::ModelDescription::input(pMVar4,feature._4_4_);
    pFVar6 = Specification::FeatureDescription::type(pFVar5);
    TVar2 = Specification::FeatureType::Type_case(pFVar6);
    if (TVar2 == kSequenceType) {
      pFVar6 = Specification::FeatureDescription::type(pFVar5);
      pSVar7 = Specification::FeatureType::sequencetype(pFVar6);
      TVar3 = Specification::SequenceFeatureType::Type_case(pSVar7);
      if ((TVar3 | 2) == kStringType) {
        return true;
      }
    }
    feature._4_4_ = feature._4_4_ + 1;
  } while( true );
}

Assistant:

bool CoreML::hasCategoricalSequences(const Specification::Model& model) {

    for (int i=0; i<model.description().input_size(); i++) {
        auto &feature = model.description().input(i);
        if (feature.type().Type_case() == Specification::FeatureType::kSequenceType) {
            switch (feature.type().sequencetype().Type_case()) {
                case Specification::SequenceFeatureType::kStringType:
                case Specification::SequenceFeatureType::kInt64Type:
                    return true;
                default:
                    break;
            }
        }
    }

    for (int i=0; i<model.description().output_size(); i++) {
        auto &feature = model.description().output(i);
        if (feature.type().Type_case() == Specification::FeatureType::kSequenceType) {
            switch (feature.type().sequencetype().Type_case()) {
                case Specification::SequenceFeatureType::kStringType:
                case Specification::SequenceFeatureType::kInt64Type:
                    return true;
                default:
                    break;
            }
        }
    }

    return false;
}